

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit_test_image_function.cpp
# Opt level: O2

FunctionRegistrator * anon_unknown.dwarf_21fb62::FunctionRegistrator::instance(void)

{
  int iVar1;
  FunctionRegistrator *in_RAX;
  FunctionRegistrator *pFVar2;
  
  if ((anonymous_namespace)::FunctionRegistrator::instance()::registrator == '\0') {
    iVar1 = __cxa_guard_acquire(&(anonymous_namespace)::FunctionRegistrator::instance()::registrator
                               );
    if (iVar1 != 0) {
      instance::registrator._function._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red
      ;
      instance::registrator._function._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
           (_Base_ptr)0x0;
      instance::registrator._function._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
           &instance::registrator._function._M_t._M_impl.super__Rb_tree_header._M_header;
      instance::registrator._function._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
           &instance::registrator._function._M_t._M_impl.super__Rb_tree_header._M_header;
      instance::registrator._function._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
      __cxa_atexit(~FunctionRegistrator,&instance::registrator,&__dso_handle);
      pFVar2 = (FunctionRegistrator *)
               __cxa_guard_release(&(anonymous_namespace)::FunctionRegistrator::instance()::
                                    registrator);
      return pFVar2;
    }
  }
  return in_RAX;
}

Assistant:

static FunctionRegistrator& instance()
        {
            static FunctionRegistrator registrator;
            return registrator;
        }